

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qlabel.cpp
# Opt level: O0

void QLabel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QLabel *this;
  bool bVar1;
  TextFormat TVar2;
  Alignment AVar3;
  int iVar4;
  TextInteractionFlags TVar5;
  QtMocHelpers *in_RCX;
  uint in_EDX;
  int in_ESI;
  long in_FS_OFFSET;
  void *_v_1;
  void *_v;
  QLabel *_t;
  QPicture *in_stack_ffffffffffffff38;
  QPixmap *in_stack_ffffffffffffff40;
  QPixmap *in_stack_ffffffffffffff48;
  QLabel *in_stack_ffffffffffffff50;
  QString *in_stack_ffffffffffffff58;
  code *in_stack_ffffffffffffff60;
  QLabel *in_stack_ffffffffffffff68;
  QMovie *in_stack_ffffffffffffff70;
  QLabel *in_stack_ffffffffffffff78;
  QPixmap local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    in_stack_ffffffffffffff48 = (QPixmap *)(ulong)in_EDX;
    switch(in_stack_ffffffffffffff48) {
    case (QPixmap *)0x0:
      linkActivated((QLabel *)in_stack_ffffffffffffff40,(QString *)in_stack_ffffffffffffff38);
      break;
    case (QPixmap *)0x1:
      linkHovered((QLabel *)in_stack_ffffffffffffff40,(QString *)in_stack_ffffffffffffff38);
      break;
    case (QPixmap *)0x2:
      setText((QLabel *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      break;
    case (QPixmap *)0x3:
      setPixmap(in_stack_ffffffffffffff68,(QPixmap *)in_stack_ffffffffffffff60);
      break;
    case (QPixmap *)0x4:
      setPicture((QLabel *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      break;
    case (QPixmap *)0x5:
      setMovie(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      break;
    case (QPixmap *)0x6:
      setNum(in_stack_ffffffffffffff50,0);
      break;
    case (QPixmap *)0x7:
      setNum(in_stack_ffffffffffffff50,(double)in_stack_ffffffffffffff48);
      break;
    case (QPixmap *)0x8:
      clear((QLabel *)in_stack_ffffffffffffff40);
    }
  }
  if (in_ESI == 5) {
    bVar1 = QtMocHelpers::indexOfMethod<void(QLabel::*)(QString_const&)>
                      (in_RCX,(void **)linkActivated,0,0);
    if (bVar1) goto switchD_005b3ad5_default;
    in_stack_ffffffffffffff60 = linkHovered;
    in_stack_ffffffffffffff68 = (QLabel *)0x0;
    bVar1 = QtMocHelpers::indexOfMethod<void(QLabel::*)(QString_const&)>
                      (in_RCX,(void **)linkHovered,0,1);
    if (bVar1) goto switchD_005b3ad5_default;
  }
  if (in_ESI == 1) {
    in_stack_ffffffffffffff58 = *(QString **)in_RCX;
    in_stack_ffffffffffffff40 = (QPixmap *)(ulong)in_EDX;
    switch(in_stack_ffffffffffffff40) {
    case (QPixmap *)0x0:
      text((QLabel *)in_stack_ffffffffffffff48);
      QString::operator=((QString *)in_stack_ffffffffffffff40,(QString *)in_stack_ffffffffffffff38);
      QString::~QString((QString *)0x5b3940);
      break;
    case (QPixmap *)0x1:
      TVar2 = textFormat((QLabel *)in_stack_ffffffffffffff40);
      *(TextFormat *)&(in_stack_ffffffffffffff58->d).d = TVar2;
      break;
    case (QPixmap *)0x2:
      pixmap((QLabel *)in_stack_ffffffffffffff48);
      QPixmap::operator=(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      QPixmap::~QPixmap(local_38);
      break;
    case (QPixmap *)0x3:
      bVar1 = hasScaledContents((QLabel *)in_stack_ffffffffffffff40);
      *(bool *)&(in_stack_ffffffffffffff58->d).d = bVar1;
      break;
    case (QPixmap *)0x4:
      AVar3 = alignment((QLabel *)in_stack_ffffffffffffff48);
      *(QFlagsStorageHelper<Qt::AlignmentFlag,_4> *)&(in_stack_ffffffffffffff58->d).d =
           AVar3.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
           super_QFlagsStorage<Qt::AlignmentFlag>.i;
      break;
    case (QPixmap *)0x5:
      bVar1 = wordWrap((QLabel *)in_stack_ffffffffffffff40);
      *(bool *)&(in_stack_ffffffffffffff58->d).d = bVar1;
      break;
    case (QPixmap *)0x6:
      iVar4 = margin((QLabel *)in_stack_ffffffffffffff40);
      *(int *)&(in_stack_ffffffffffffff58->d).d = iVar4;
      break;
    case (QPixmap *)0x7:
      iVar4 = indent((QLabel *)in_stack_ffffffffffffff40);
      *(int *)&(in_stack_ffffffffffffff58->d).d = iVar4;
      break;
    case (QPixmap *)0x8:
      bVar1 = openExternalLinks((QLabel *)in_stack_ffffffffffffff40);
      *(bool *)&(in_stack_ffffffffffffff58->d).d = bVar1;
      break;
    case (QPixmap *)0x9:
      TVar5 = textInteractionFlags((QLabel *)in_stack_ffffffffffffff40);
      *(QFlagsStorageHelper<Qt::TextInteractionFlag,_4> *)&(in_stack_ffffffffffffff58->d).d =
           TVar5.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
           super_QFlagsStorage<Qt::TextInteractionFlag>.i;
      break;
    case (QPixmap *)0xa:
      bVar1 = hasSelectedText((QLabel *)in_stack_ffffffffffffff48);
      *(bool *)&(in_stack_ffffffffffffff58->d).d = bVar1;
      break;
    case (QPixmap *)0xb:
      selectedText((QLabel *)in_stack_ffffffffffffff48);
      QString::operator=((QString *)in_stack_ffffffffffffff40,(QString *)in_stack_ffffffffffffff38);
      QString::~QString((QString *)0x5b3a93);
    }
  }
  if (in_ESI == 2) {
    this = *(QLabel **)in_RCX;
    AVar3.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.super_QFlagsStorage<Qt::AlignmentFlag>.i =
         SUB84((ulong)in_stack_ffffffffffffff68 >> 0x20,0);
    switch(in_EDX) {
    case 0:
      setText((QLabel *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      break;
    case 1:
      setTextFormat(this,(TextFormat)((ulong)in_stack_ffffffffffffff48 >> 0x20));
      break;
    case 2:
      setPixmap(in_stack_ffffffffffffff68,(QPixmap *)in_stack_ffffffffffffff60);
      break;
    case 3:
      setScaledContents((QLabel *)in_stack_ffffffffffffff48,
                        SUB81((ulong)in_stack_ffffffffffffff40 >> 0x38,0));
      break;
    case 4:
      setAlignment(this,AVar3);
      break;
    case 5:
      setWordWrap((QLabel *)in_stack_ffffffffffffff40,false);
      break;
    case 6:
      setMargin((QLabel *)in_stack_ffffffffffffff40,0);
      break;
    case 7:
      setIndent((QLabel *)in_stack_ffffffffffffff40,0);
      break;
    case 8:
      setOpenExternalLinks((QLabel *)in_stack_ffffffffffffff40,false);
      break;
    case 9:
      setTextInteractionFlags
                (this,(TextInteractionFlags)
                      AVar3.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
                      super_QFlagsStorage<Qt::AlignmentFlag>.i);
    }
  }
switchD_005b3ad5_default:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QLabel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QLabel *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->linkActivated((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->linkHovered((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 2: _t->setText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 3: _t->setPixmap((*reinterpret_cast< std::add_pointer_t<QPixmap>>(_a[1]))); break;
        case 4: _t->setPicture((*reinterpret_cast< std::add_pointer_t<QPicture>>(_a[1]))); break;
        case 5: _t->setMovie((*reinterpret_cast< std::add_pointer_t<QMovie*>>(_a[1]))); break;
        case 6: _t->setNum((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 7: _t->setNum((*reinterpret_cast< std::add_pointer_t<double>>(_a[1]))); break;
        case 8: _t->clear(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QLabel::*)(const QString & )>(_a, &QLabel::linkActivated, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QLabel::*)(const QString & )>(_a, &QLabel::linkHovered, 1))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QString*>(_v) = _t->text(); break;
        case 1: *reinterpret_cast<Qt::TextFormat*>(_v) = _t->textFormat(); break;
        case 2: *reinterpret_cast<QPixmap*>(_v) = _t->pixmap(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->hasScaledContents(); break;
        case 4: *reinterpret_cast<Qt::Alignment*>(_v) = _t->alignment(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->wordWrap(); break;
        case 6: *reinterpret_cast<int*>(_v) = _t->margin(); break;
        case 7: *reinterpret_cast<int*>(_v) = _t->indent(); break;
        case 8: *reinterpret_cast<bool*>(_v) = _t->openExternalLinks(); break;
        case 9: *reinterpret_cast<Qt::TextInteractionFlags*>(_v) = _t->textInteractionFlags(); break;
        case 10: *reinterpret_cast<bool*>(_v) = _t->hasSelectedText(); break;
        case 11: *reinterpret_cast<QString*>(_v) = _t->selectedText(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setText(*reinterpret_cast<QString*>(_v)); break;
        case 1: _t->setTextFormat(*reinterpret_cast<Qt::TextFormat*>(_v)); break;
        case 2: _t->setPixmap(*reinterpret_cast<QPixmap*>(_v)); break;
        case 3: _t->setScaledContents(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setAlignment(*reinterpret_cast<Qt::Alignment*>(_v)); break;
        case 5: _t->setWordWrap(*reinterpret_cast<bool*>(_v)); break;
        case 6: _t->setMargin(*reinterpret_cast<int*>(_v)); break;
        case 7: _t->setIndent(*reinterpret_cast<int*>(_v)); break;
        case 8: _t->setOpenExternalLinks(*reinterpret_cast<bool*>(_v)); break;
        case 9: _t->setTextInteractionFlags(*reinterpret_cast<Qt::TextInteractionFlags*>(_v)); break;
        default: break;
        }
    }
}